

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::objectivec::anon_unknown_0::SanitizeNameForObjC
                   (string *__return_storage_ptr__,string *prefix,string *input,string *extension,
                   string *out_suffix_added)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  size_type sVar6;
  string *num_words;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  StringPiece local_80;
  StringPiece local_70;
  undefined1 local_60 [8];
  string sanitized;
  string *out_suffix_added_local;
  string *extension_local;
  string *input_local;
  string *prefix_local;
  
  num_words = extension;
  if (((anonymous_namespace)::
       SanitizeNameForObjC(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*)
       ::kReservedWords_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   SanitizeNameForObjC(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*)
                                   ::kReservedWords_abi_cxx11_), iVar2 != 0)) {
    (anonymous_namespace)::MakeWordsMap_abi_cxx11_
              (&(anonymous_namespace)::
                SanitizeNameForObjC(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*)
                ::kReservedWords_abi_cxx11_,
               (_anonymous_namespace_ *)(anonymous_namespace)::kReservedWordList,(char **)0x95,
               (size_t)num_words);
    __cxa_atexit(std::
                 unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::~unordered_set,
                 &(anonymous_namespace)::
                  SanitizeNameForObjC(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*)
                  ::kReservedWords_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         SanitizeNameForObjC(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*)
                         ::kReservedWords_abi_cxx11_);
  }
  if (((anonymous_namespace)::
       SanitizeNameForObjC(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*)
       ::kNSObjectMethods_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   SanitizeNameForObjC(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*)
                                   ::kNSObjectMethods_abi_cxx11_), iVar2 != 0)) {
    (anonymous_namespace)::MakeWordsMap_abi_cxx11_
              (&(anonymous_namespace)::
                SanitizeNameForObjC(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*)
                ::kNSObjectMethods_abi_cxx11_,(_anonymous_namespace_ *)kNSObjectMethodsList,
               (char **)0xb9,(size_t)num_words);
    __cxa_atexit(std::
                 unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::~unordered_set,
                 &(anonymous_namespace)::
                  SanitizeNameForObjC(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*)
                  ::kNSObjectMethods_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         SanitizeNameForObjC(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*)
                         ::kNSObjectMethods_abi_cxx11_);
  }
  std::__cxx11::string::string((string *)local_60);
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_70,input);
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_80,prefix);
  bVar1 = HasPrefixString(local_70,local_80);
  if (bVar1) {
    lVar3 = std::__cxx11::string::length();
    lVar4 = std::__cxx11::string::length();
    if (lVar3 != lVar4) {
      std::__cxx11::string::length();
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)input);
      bVar1 = ascii_isupper(*pcVar5);
      if (bVar1) {
        std::__cxx11::string::operator=((string *)local_60,(string *)input);
        goto LAB_004b6adf;
      }
    }
    std::operator+(&local_a0,prefix,input);
    std::__cxx11::string::operator=((string *)local_60,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  else {
    std::operator+(&local_c0,prefix,input);
    std::__cxx11::string::operator=((string *)local_60,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
  }
LAB_004b6adf:
  bVar1 = IsReservedCIdentifier((string *)local_60);
  if (((bVar1) ||
      (sVar6 = std::
               unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::count(&(anonymous_namespace)::
                        SanitizeNameForObjC(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*)
                        ::kReservedWords_abi_cxx11_,(key_type *)local_60), sVar6 != 0)) ||
     (sVar6 = std::
              unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&(anonymous_namespace)::
                       SanitizeNameForObjC(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*)
                       ::kNSObjectMethods_abi_cxx11_,(key_type *)local_60), sVar6 != 0)) {
    if (out_suffix_added != (string *)0x0) {
      std::__cxx11::string::operator=((string *)out_suffix_added,(string *)extension);
    }
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                   extension);
  }
  else {
    if (out_suffix_added != (string *)0x0) {
      std::__cxx11::string::clear();
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_60);
  }
  std::__cxx11::string::~string((string *)local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string SanitizeNameForObjC(const std::string& prefix,
                           const std::string& input,
                           const std::string& extension,
                           std::string* out_suffix_added) {
  static const std::unordered_set<std::string> kReservedWords =
      MakeWordsMap(kReservedWordList, GOOGLE_ARRAYSIZE(kReservedWordList));
  static const std::unordered_set<std::string> kNSObjectMethods =
      MakeWordsMap(kNSObjectMethodsList, GOOGLE_ARRAYSIZE(kNSObjectMethodsList));
  std::string sanitized;
  // We add the prefix in the cases where the string is missing a prefix.
  // We define "missing a prefix" as where 'input':
  // a) Doesn't start with the prefix or
  // b) Isn't equivalent to the prefix or
  // c) Has the prefix, but the letter after the prefix is lowercase
  if (HasPrefixString(input, prefix)) {
    if (input.length() == prefix.length() || !ascii_isupper(input[prefix.length()])) {
      sanitized = prefix + input;
    } else {
      sanitized = input;
    }
  } else {
    sanitized = prefix + input;
  }
  if (IsReservedCIdentifier(sanitized) ||
      (kReservedWords.count(sanitized) > 0) ||
      (kNSObjectMethods.count(sanitized) > 0)) {
    if (out_suffix_added) *out_suffix_added = extension;
    return sanitized + extension;
  }
  if (out_suffix_added) out_suffix_added->clear();
  return sanitized;
}